

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

double find_double(var *element,string *name,string *desired_units,string *default_units,
                  double default_value)

{
  bool bVar1;
  string *in_RCX;
  string *in_RDX;
  double in_XMM0_Qa;
  string units;
  var *current;
  char *in_stack_ffffffffffffff28;
  var *in_stack_ffffffffffffff30;
  string *in_stack_ffffffffffffff38;
  string *desired_units_00;
  string *initial_units;
  string local_b0 [48];
  string local_80 [36];
  undefined4 local_5c;
  string local_58 [32];
  var *local_38;
  double local_30;
  string *local_20;
  double local_8;
  
  local_30 = in_XMM0_Qa;
  local_20 = in_RDX;
  local_38 = find(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  bVar1 = std::operator==(&in_stack_ffffffffffffff30->name,in_stack_ffffffffffffff28);
  initial_units = in_RCX;
  if (!bVar1) {
    initial_units = (string *)&local_38->units;
  }
  std::__cxx11::string::string(local_58,initial_units);
  if ((local_38->value != 0.0) || (NAN(local_38->value))) {
    desired_units_00 = (string *)local_38->value;
    std::__cxx11::string::string(local_80,local_58);
    std::__cxx11::string::string(local_b0,local_20);
    local_8 = convert_units((double)in_RCX,(string *)initial_units,desired_units_00);
    std::__cxx11::string::~string(local_b0);
    std::__cxx11::string::~string(local_80);
  }
  else {
    local_8 = local_30;
  }
  local_5c = 1;
  std::__cxx11::string::~string(local_58);
  return local_8;
}

Assistant:

double find_double(var * element, const string & name, const string & desired_units, string default_units = "",
        double default_value = 0.0) {
    var * current = find(name, element);
    string units = current->units == "#" ? default_units : current->units;

    if (current->value == 0) {
        return default_value;
    } else {
        return convert_units(current->value, units, desired_units);
    }
}